

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::WirePointer::setKindForOrphan(WirePointer *this,Kind kind)

{
  bool bVar1;
  Fault local_20;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Kind kind_local;
  WirePointer *this_local;
  
  f.exception._4_4_ = kind;
  f.exception._2_1_ = isPositional(this);
  f.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc3,FAILED,"isPositional()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 3));
    kj::_::Debug::Fault::fatal(&local_20);
  }
  DirectWireValue<unsigned_int>::set(&this->offsetAndKind,f.exception._4_4_ | ~OTHER);
  return;
}

Assistant:

KJ_ALWAYS_INLINE(void setKindForOrphan(Kind kind)) {
    // OrphanBuilder contains a WirePointer, but since it isn't located in a segment, it should
    // not have a valid offset (unless it is a FAR or OTHER pointer).  We set its offset to -1
    // because setting it to zero would mean a pointer to an empty struct would appear to be a null
    // pointer.
    KJ_DREQUIRE(isPositional());
    offsetAndKind.set(kind | 0xfffffffc);
  }